

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_unit_strings.cpp
# Opt level: O3

void __thiscall unitStrings_Hertz_Test::TestBody(unitStrings_Hertz_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  unit_data uVar2;
  precise_unit *ppVar3;
  uint64_t in_RCX;
  undefined1 *puVar4;
  uint64_t uVar5;
  char *pcVar6;
  internal local_58 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_50;
  AssertHelper local_48;
  ulong local_40;
  string local_38;
  
  ppVar3 = (precise_unit *)units::getDefaultFlags();
  units::to_string_abi_cxx11_(&local_38,(units *)units::precise::Hz,ppVar3,in_RCX);
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[3]>
            (local_58,"to_string(precise::Hz)","\"Hz\"",&local_38,(char (*) [3])0x1fcb5b);
  paVar1 = &local_38.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != paVar1) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  if (local_58[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_38);
    if (local_50 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = (local_50->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x19e,pcVar6);
    testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_38);
    testing::internal::AssertHelper::~AssertHelper(&local_48);
    if ((long *)local_38._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_38._M_dataplus._M_p + 8))();
    }
  }
  if (local_50 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_50,local_50);
  }
  uVar2 = units::detail::unit_data::operator*
                    ((unit_data *)(units::precise::milli + 8),(unit_data *)(units::precise::Hz + 8))
  ;
  local_40 = (ulong)(uint)uVar2;
  puVar4 = &DAT_3f50624dd2f1a9fc;
  local_48.data_ = (AssertHelperData *)&DAT_3f50624dd2f1a9fc;
  ppVar3 = (precise_unit *)units::getDefaultFlags();
  units::to_string_abi_cxx11_(&local_38,(units *)&local_48,ppVar3,(uint64_t)puVar4);
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[4]>
            (local_58,"to_string(precise::milli * precise::Hz)","\"mHz\"",&local_38,
             (char (*) [4])"mHz");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != paVar1) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  if (local_58[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_38);
    if (local_50 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = (local_50->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x19f,pcVar6);
    testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_38);
    testing::internal::AssertHelper::~AssertHelper(&local_48);
    if ((long *)local_38._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_38._M_dataplus._M_p + 8))();
    }
  }
  if (local_50 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_50,local_50);
  }
  uVar2 = units::detail::unit_data::operator*
                    ((unit_data *)(units::precise::kilo + 8),(unit_data *)(units::precise::Hz + 8));
  local_40 = (ulong)(uint)uVar2;
  uVar5 = 0x408f400000000000;
  local_48.data_ = (AssertHelperData *)0x408f400000000000;
  ppVar3 = (precise_unit *)units::getDefaultFlags();
  units::to_string_abi_cxx11_(&local_38,(units *)&local_48,ppVar3,uVar5);
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[4]>
            (local_58,"to_string(precise::kilo * precise::Hz)","\"kHz\"",&local_38,
             (char (*) [4])"kHz");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != paVar1) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  if (local_58[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_38);
    if (local_50 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = (local_50->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x1a0,pcVar6);
    testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_38);
    testing::internal::AssertHelper::~AssertHelper(&local_48);
    if ((long *)local_38._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_38._M_dataplus._M_p + 8))();
    }
  }
  if (local_50 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_50,local_50);
  }
  uVar2 = units::detail::unit_data::operator*
                    ((unit_data *)(units::precise::mega + 8),(unit_data *)(units::precise::Hz + 8));
  local_40 = (ulong)(uint)uVar2;
  puVar4 = &DAT_412e848000000000;
  local_48.data_ = (AssertHelperData *)&DAT_412e848000000000;
  ppVar3 = (precise_unit *)units::getDefaultFlags();
  units::to_string_abi_cxx11_(&local_38,(units *)&local_48,ppVar3,(uint64_t)puVar4);
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[4]>
            (local_58,"to_string(precise::mega * precise::Hz)","\"MHz\"",&local_38,
             (char (*) [4])"MHz");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != paVar1) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  if (local_58[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_38);
    if (local_50 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = (local_50->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x1a1,pcVar6);
    testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_38);
    testing::internal::AssertHelper::~AssertHelper(&local_48);
    if ((long *)local_38._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_38._M_dataplus._M_p + 8))();
    }
  }
  if (local_50 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_50,local_50);
  }
  uVar2 = units::detail::unit_data::operator*
                    ((unit_data *)(units::precise::giga + 8),(unit_data *)(units::precise::Hz + 8));
  local_40 = (ulong)(uint)uVar2;
  uVar5 = 0x41cdcd6500000000;
  local_48.data_ = (AssertHelperData *)0x41cdcd6500000000;
  ppVar3 = (precise_unit *)units::getDefaultFlags();
  units::to_string_abi_cxx11_(&local_38,(units *)&local_48,ppVar3,uVar5);
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[4]>
            (local_58,"to_string(precise::giga * precise::Hz)","\"GHz\"",&local_38,
             (char (*) [4])"GHz");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != paVar1) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  if (local_58[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_38);
    if (local_50 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = (local_50->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x1a2,pcVar6);
    testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_38);
    testing::internal::AssertHelper::~AssertHelper(&local_48);
    if ((long *)local_38._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_38._M_dataplus._M_p + 8))();
    }
  }
  if (local_50 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_50,local_50);
  }
  uVar2 = units::detail::unit_data::operator*
                    ((unit_data *)(units::precise::tera + 8),(unit_data *)(units::precise::Hz + 8));
  local_40 = (ulong)(uint)uVar2;
  uVar5 = 0x426d1a94a2000000;
  local_48.data_ = (AssertHelperData *)0x426d1a94a2000000;
  ppVar3 = (precise_unit *)units::getDefaultFlags();
  units::to_string_abi_cxx11_(&local_38,(units *)&local_48,ppVar3,uVar5);
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[4]>
            (local_58,"to_string(precise::tera * precise::Hz)","\"THz\"",&local_38,
             (char (*) [4])"THz");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != paVar1) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  if (local_58[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_38);
    if (local_50 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = (local_50->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x1a3,pcVar6);
    testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_38);
    testing::internal::AssertHelper::~AssertHelper(&local_48);
    if ((long *)local_38._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_38._M_dataplus._M_p + 8))();
    }
  }
  if (local_50 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_50,local_50);
  }
  return;
}

Assistant:

TEST(unitStrings, Hertz)
{
    EXPECT_EQ(to_string(precise::Hz), "Hz");
    EXPECT_EQ(to_string(precise::milli * precise::Hz), "mHz");
    EXPECT_EQ(to_string(precise::kilo * precise::Hz), "kHz");
    EXPECT_EQ(to_string(precise::mega * precise::Hz), "MHz");
    EXPECT_EQ(to_string(precise::giga * precise::Hz), "GHz");
    EXPECT_EQ(to_string(precise::tera * precise::Hz), "THz");
}